

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryProtocol.cpp
# Opt level: O1

Status __thiscall mognetwork::protocol::BinaryProtocol::onReadTrigger(BinaryProtocol *this)

{
  uint32_t *puVar1;
  ReadedDatas *pRVar2;
  uint uVar3;
  Status SVar4;
  Status SVar5;
  ulong uVar6;
  pointer size;
  Status unaff_EBX;
  size_t readed;
  char buffer [1024];
  size_t local_430;
  char local_428 [1032];
  
  uVar6 = (this->super_AProtocolListener).m_pendingDatas.readed;
  if (uVar6 < 4) {
    SVar4 = TcpSocket::receive((this->super_AProtocolListener).m_socket,
                               (char *)((long)&(this->super_AProtocolListener).m_pendingDatas.
                                               totalSize + uVar6),4 - uVar6,&local_430,0);
    uVar6 = (this->super_AProtocolListener).m_pendingDatas.readed + local_430;
    (this->super_AProtocolListener).m_pendingDatas.readed = uVar6;
    if (SVar4 != Ok) {
      return SVar4;
    }
    unaff_EBX = Ok;
    if (3 < uVar6) {
      puVar1 = &(this->super_AProtocolListener).m_pendingDatas.totalSize;
      uVar3 = *puVar1;
      *puVar1 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    }
  }
  if (3 < (this->super_AProtocolListener).m_pendingDatas.readed) {
    size = (this->super_AProtocolListener).m_pendingDatas.datas.
           super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
           + ((ulong)(this->super_AProtocolListener).m_pendingDatas.totalSize -
             (long)(this->super_AProtocolListener).m_pendingDatas.datas.
                   super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                   _M_finish);
    if ((pointer)0x3ff < size) {
      size = (pointer)0x400;
    }
    SVar5 = TcpSocket::receive((this->super_AProtocolListener).m_socket,local_428,(size_t)size,
                               &local_430,0);
    SVar4 = SVar5;
    if ((SVar5 == Ok) &&
       (pRVar2 = &(this->super_AProtocolListener).m_pendingDatas,
       pRVar2->readed = pRVar2->readed + local_430, SVar4 = unaff_EBX, local_430 != 0)) {
      std::vector<char,_std::allocator<char>_>::resize
                (&(this->super_AProtocolListener).m_pendingDatas.datas,
                 (size_type)
                 ((this->super_AProtocolListener).m_pendingDatas.datas.
                  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                  _M_finish +
                 (local_430 -
                 (long)(this->super_AProtocolListener).m_pendingDatas.datas.
                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start)),'\0');
      memcpy((this->super_AProtocolListener).m_pendingDatas.datas.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish + -local_430,local_428,local_430);
    }
    if (SVar5 != Ok) {
      return SVar4;
    }
  }
  return Waiting;
}

Assistant:

Socket::Status BinaryProtocol::onReadTrigger()
    {
      std::size_t readed;
      char buffer[1024];

      // Get the size of the packet
      if (m_pendingDatas.readed < sizeof(uint32_t))
	{
	  char* data = reinterpret_cast<char*>(&m_pendingDatas.totalSize) + m_pendingDatas.readed;
	  Socket::Status status = m_socket->receive(data, sizeof(uint32_t) - m_pendingDatas.readed, readed, 0);
	  m_pendingDatas.readed += readed;
	  if (status != Socket::Ok)
	    return status;
	  if (m_pendingDatas.readed >= sizeof(uint32_t))
	    m_pendingDatas.totalSize = ntohl(m_pendingDatas.totalSize);
	}
      // Read the packet
      if (m_pendingDatas.readed >= sizeof(uint32_t))
	{
	  std::size_t toGet = std::min(static_cast<std::size_t>(m_pendingDatas.totalSize - m_pendingDatas.datas.size()), sizeof(buffer));
	  Socket::Status status = m_socket->receive(buffer, toGet, readed, 0);
	  if (status != Socket::Ok)
	    return status;
	  m_pendingDatas.readed += readed;
	  if (readed > 0)
	    {
	      m_pendingDatas.datas.resize(m_pendingDatas.datas.size() + readed);
	      char* begin = &m_pendingDatas.datas[0] + m_pendingDatas.datas.size() - readed;
	      std::memcpy(begin, buffer, readed);
	    }
	}
      return Socket::Waiting;
    }